

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::InitGLExtension::exec(InitGLExtension *this,Thread *t)

{
  ostream *poVar1;
  _func_int **pp_Var2;
  int iVar3;
  Thread *pTVar4;
  char *__s;
  long lVar5;
  string *__lhs;
  undefined8 uVar6;
  NotSupportedError *this_00;
  byte bVar7;
  bool bVar8;
  Thread *pTVar9;
  bool bVar10;
  string extensions;
  string extension;
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0;
  char *local_1d8;
  long local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pTVar4 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar4 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  local_1c0._0_8_ = pTVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),"Begin -- glGetString(GL_EXTENSIONS)",0x23);
  tcu::ThreadUtil::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base(local_138);
  __s = (char *)(**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0xa78))(0x1f03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,__s,(allocator<char> *)local_1c0);
  local_1c0._0_8_ = pTVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),"End -- glGetString()",0x14);
  tcu::ThreadUtil::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base(local_138);
  lVar5 = std::__cxx11::string::find((char *)&local_1e0,0x1ccb4c2,0);
  __lhs = &this->m_extension;
  bVar10 = false;
  do {
    local_1c0._0_8_ = local_1b0;
    local_1c0._8_8_ = 0;
    local_1b0[0] = '\0';
    if (lVar5 == -1) {
      std::__cxx11::string::_M_assign((string *)local_1c0);
      std::__cxx11::string::_M_replace((ulong)&local_1e0,0,local_1d8,0x1af8059);
    }
    else {
      std::__cxx11::string::substr((ulong)local_200,(ulong)&local_1e0);
      std::__cxx11::string::operator=((string *)local_1c0,(string *)local_200);
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
      std::__cxx11::string::substr((ulong)local_200,(ulong)&local_1e0);
      std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_200);
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
    }
    pTVar9 = (Thread *)local_1c0._0_8_;
    if (local_1c0._8_8_ == (this->m_extension)._M_string_length) {
      bVar8 = true;
      if (local_1c0._8_8_ == 0) {
        bVar7 = 1;
      }
      else {
        iVar3 = bcmp((void *)local_1c0._0_8_,(__lhs->_M_dataplus)._M_p,local_1c0._8_8_);
        bVar7 = 1;
        if (iVar3 != 0) goto LAB_00df3049;
      }
    }
    else {
LAB_00df3049:
      bVar7 = 0;
      lVar5 = std::__cxx11::string::find((char *)&local_1e0,0x1ccb4c2,0);
      pTVar9 = (Thread *)local_1c0._0_8_;
      bVar8 = bVar10;
    }
    if (pTVar9 != (Thread *)local_1b0) {
      operator_delete(pTVar9,CONCAT71(local_1b0._1_7_,local_1b0[0]) + 1);
    }
    bVar10 = bVar8;
    if (!(bool)(~bVar7 & lVar5 != -1)) {
      if (bVar8) {
        iVar3 = std::__cxx11::string::compare((char *)__lhs);
        if (iVar3 == 0) {
          local_1c0._0_8_ = pTVar4;
          std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),
                     "Begin -- eglGetProcAddress(\"glEGLImageTargetTexture2DOES\")",0x3a);
          tcu::ThreadUtil::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
          std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
          std::ios_base::~ios_base(local_138);
          pp_Var2 = pTVar4[1].super_Thread._vptr_Thread;
          uVar6 = (**(code **)(*pp_Var2 + 0x110))(pp_Var2,"glEGLImageTargetTexture2DOES");
          *(undefined8 *)(*(long *)&pTVar4[1].m_random.m_rnd + 0x58) = uVar6;
          local_1c0._0_8_ = pTVar4;
          std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
          poVar1 = (ostream *)(local_1b0 + 8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End --  ",8);
          std::ostream::_M_insert<void_const*>(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," = eglGetProcAddress()",0x16);
          tcu::ThreadUtil::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
          std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
          std::ios_base::~ios_base(local_138);
        }
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        return;
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                     __lhs," not supported");
      tcu::NotSupportedError::NotSupportedError
                (this_00,(char *)local_1c0._0_8_,::glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                 ,0x30b);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  } while( true );
}

Assistant:

void InitGLExtension::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	// Check extensions
	bool found = false;

	thread.newMessage() << "Begin -- glGetString(GL_EXTENSIONS)" << tcu::ThreadUtil::Message::End;
	std::string extensions = (const char*)thread.gl.getString(GL_EXTENSIONS);
	thread.newMessage() << "End -- glGetString()" << tcu::ThreadUtil::Message::End;

	std::string::size_type pos = extensions.find(" ");

	do
	{
		std::string extension;
		if (pos != std::string::npos)
		{
			extension = extensions.substr(0, pos);
			extensions = extensions.substr(pos+1);
		}
		else
		{
			extension = extensions;
			extensions = "";
		}

		if (extension == m_extension)
		{
			found = true;
			break;
		}
		pos = extensions.find(" ");
	} while (pos != std::string::npos);

	if (!found)
		throw tcu::NotSupportedError((m_extension + " not supported").c_str(), "", __FILE__, __LINE__);


	// Query function pointers
	if (m_extension == "GL_OES_EGL_image")
	{
		thread.newMessage() << "Begin -- eglGetProcAddress(\"glEGLImageTargetTexture2DOES\")" << tcu::ThreadUtil::Message::End;
		thread.runtimeContext->glExtensions.imageTargetTexture2D = (glEGLImageTargetTexture2DOESFunc)thread.egl.getProcAddress("glEGLImageTargetTexture2DOES");
		thread.newMessage() << "End --  " << ((void*)thread.runtimeContext->glExtensions.imageTargetTexture2D) << " = eglGetProcAddress()"<< tcu::ThreadUtil::Message::End;
	}
}